

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cpp
# Opt level: O3

ssize_t __thiscall
anon_unknown.dwarf_2ab34db::Pipe::write(Pipe *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  _Map_pointer ppuVar2;
  _Map_pointer ppuVar3;
  _Elt_pointer puVar4;
  _Elt_pointer puVar5;
  _Elt_pointer puVar6;
  _Elt_pointer puVar7;
  undefined4 in_register_00000034;
  uchar *__args;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_40;
  
  __args = (uchar *)CONCAT44(in_register_00000034,__fd);
  local_40._M_device = &this->mutex;
  local_40._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_40);
  local_40._M_owns = true;
  bVar1 = this->closed;
  if (__buf != (void *)0x0 && bVar1 == false) {
    ppuVar2 = (this->data).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Deque_impl_data._M_finish._M_node;
    ppuVar3 = (this->data).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Deque_impl_data._M_start._M_node;
    puVar4 = (this->data).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
    puVar5 = (this->data).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Deque_impl_data._M_finish._M_first;
    puVar6 = (this->data).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Deque_impl_data._M_start._M_cur;
    puVar7 = (this->data).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Deque_impl_data._M_start._M_last;
    do {
      std::deque<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char_const&>
                ((deque<unsigned_char,std::allocator<unsigned_char>> *)&this->data,__args);
      __args = __args + 1;
      __buf = (void *)((long)__buf + -1);
    } while (__buf != (void *)0x0);
    if (puVar7 + (long)(puVar4 + (((((ulong)((long)ppuVar2 - (long)ppuVar3) >> 3) - 1) +
                                  (ulong)(ppuVar2 == (_Map_pointer)0x0)) * 0x200 - (long)puVar5)) ==
        puVar6) {
      std::condition_variable::notify_all();
    }
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_40);
  return (CONCAT71((int7)((ulong)&local_40 >> 8),bVar1) ^ 1) & 0xffffffff;
}

Assistant:

bool write(const void* buffer, size_t bytes) override {
    std::unique_lock<std::mutex> lock(mutex);
    if (closed) {
      return false;
    }
    if (bytes == 0) {
      return true;
    }
    auto notify = data.size() == 0;
    auto src = reinterpret_cast<const uint8_t*>(buffer);
    for (size_t i = 0; i < bytes; i++) {
      data.emplace_back(src[i]);
    }
    if (notify) {
      cv.notify_all();
    }
    return true;
  }